

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

byte * __thiscall
Js::ByteCodeBufferReader::DeserializeIntArray
          (ByteCodeBufferReader *this,ScriptContext *scriptContext,byte *buffer,
          ByteBlock *deserializeInto)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  byte *pbVar6;
  size_t sVar7;
  AuxArray<int> local_58;
  uint local_54;
  int32 value;
  uint index;
  byte *current;
  byte *content;
  AuxArray<int> *pAStack_38;
  uint count;
  AuxArray<int> *result;
  SerializedIntArray *serialized;
  ByteBlock *deserializeInto_local;
  byte *buffer_local;
  ScriptContext *scriptContext_local;
  ByteCodeBufferReader *this_local;
  
  uVar1 = *(uint *)buffer;
  result = (AuxArray<int> *)buffer;
  serialized = (SerializedIntArray *)deserializeInto;
  deserializeInto_local = (ByteBlock *)buffer;
  buffer_local = (byte *)scriptContext;
  scriptContext_local = (ScriptContext *)this;
  uVar4 = ByteBlock::GetLength(deserializeInto);
  if ((ulong)uVar4 <= (ulong)uVar1 + 4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12a4,
                                "(serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength())"
                                ,
                                "serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pbVar6 = ByteBlock::GetBuffer((ByteBlock *)serialized);
  pAStack_38 = (AuxArray<int> *)(pbVar6 + result->count);
  content._4_4_ = *(uint32 *)((long)&result[1].count + 1);
  pAStack_38->count = content._4_4_;
  uVar1 = result->count;
  sVar7 = AuxArray<int>::GetDataSize(pAStack_38);
  uVar4 = ByteBlock::GetLength((ByteBlock *)serialized);
  if ((ulong)uVar4 < uVar1 + sVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                ,0x12a8,
                                "(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength())"
                                ,
                                "serialized->offset + result->GetDataSize() <= deserializeInto->GetLength()"
                               );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  _value = (byte *)((long)&result[2].count + 1);
  current = _value;
  for (local_54 = 0; local_54 < content._4_4_; local_54 = local_54 + 1) {
    _value = ReadConstantSizedInt32(this,_value,(int *)&local_58);
    pAStack_38[(ulong)local_54 + 1].count = local_58.count;
  }
  return _value;
}

Assistant:

const byte * DeserializeIntArray(ScriptContext * scriptContext, const byte * buffer, ByteBlock * deserializeInto)
    {
        auto serialized = (serialization_alignment const Js::SerializedIntArray *)buffer;
#ifdef BYTE_CODE_MAGIC_CONSTANTS
        Assert(serialized->magic == magicStartOfAuxIntArray);
#endif
        Assert(serialized->offset + sizeof(AuxArray<int>) < deserializeInto->GetLength());
        auto result = (AuxArray<int> *)(deserializeInto->GetBuffer() + serialized->offset);
        uint count = serialized->intCount;
        result->count = count;
        Assert(serialized->offset + result->GetDataSize() <= deserializeInto->GetLength());

        auto content = (const byte*)(serialized + 1);
        auto current = content;
        for (uint index = 0; index < count; index++)
        {
            int32 value;
            current = ReadConstantSizedInt32(current, &value);
            result->elements[index] = value;
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        int magicEnd;
        current = ReadInt32(current, &magicEnd);
        Assert(magicEnd == magicEndOfAuxIntArray);
#endif
        return current;
    }